

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O1

int16_t WebRtcIsac_RateAllocation
                  (int32_t inRateBitPerSec,double *rateLBBitPerSec,double *rateUBBitPerSec,
                  ISACBandwidth *bandwidthKHz)

{
  short sVar1;
  short sVar2;
  int32_t iVar3;
  short sVar4;
  ISACBandwidth IVar5;
  double dVar6;
  double dVar7;
  
  if (inRateBitPerSec < 38000) {
    iVar3 = 32000;
    if (inRateBitPerSec < 32000) {
      iVar3 = inRateBitPerSec;
    }
    *rateLBBitPerSec = (double)(int)(short)iVar3;
    IVar5 = isac8kHz;
    dVar6 = 0.0;
  }
  else if (inRateBitPerSec < 50000) {
    dVar7 = (double)(inRateBitPerSec + -38000) * 0.00085714286;
    dVar6 = 6.0;
    if (dVar7 <= 6.0) {
      dVar6 = dVar7;
    }
    sVar4 = (short)(int)dVar6;
    sVar1 = kLowerBandBitRate12[sVar4];
    *rateLBBitPerSec = (double)(int)sVar1;
    sVar2 = kUpperBandBitRate12[sVar4];
    *rateUBBitPerSec = (double)(int)sVar2;
    IVar5 = isac12kHz;
    if (5 < sVar4) goto LAB_0015409a;
    *rateLBBitPerSec =
         (double)(int)(short)(int)((double)((int)kLowerBandBitRate12[(long)sVar4 + 1] - (int)sVar1)
                                  * (dVar7 - (double)(int)sVar4)) + *rateLBBitPerSec;
    dVar6 = (double)(int)(short)(int)((double)((int)kUpperBandBitRate12[(long)sVar4 + 1] -
                                              (int)sVar2) * (dVar7 - (double)(int)sVar4)) +
            *rateUBBitPerSec;
    IVar5 = isac12kHz;
  }
  else {
    if (56000 < inRateBitPerSec) {
      return -1;
    }
    dVar7 = (double)(inRateBitPerSec + -50000) * 0.00083333333;
    dVar6 = 5.0;
    if (dVar7 <= 5.0) {
      dVar6 = dVar7;
    }
    sVar4 = (short)(int)dVar6;
    sVar1 = kLowerBandBitRate16[sVar4];
    *rateLBBitPerSec = (double)(int)sVar1;
    sVar2 = kUpperBandBitRate16[sVar4];
    *rateUBBitPerSec = (double)(int)sVar2;
    IVar5 = isac16kHz;
    if (4 < sVar4) goto LAB_0015409a;
    *rateLBBitPerSec =
         (double)(int)(short)(int)((double)((int)kLowerBandBitRate16[(long)sVar4 + 1] - (int)sVar1)
                                  * (dVar7 - (double)(int)sVar4)) + *rateLBBitPerSec;
    dVar6 = (double)(int)(short)(int)((double)((int)kUpperBandBitRate16[(long)sVar4 + 1] -
                                              (int)sVar2) * (dVar7 - (double)(int)sVar4)) +
            *rateUBBitPerSec;
    IVar5 = isac16kHz;
  }
  *rateUBBitPerSec = dVar6;
LAB_0015409a:
  *bandwidthKHz = IVar5;
  dVar6 = 32000.0;
  if (*rateLBBitPerSec <= 32000.0) {
    dVar6 = *rateLBBitPerSec;
  }
  *rateLBBitPerSec = dVar6;
  dVar6 = 32000.0;
  if (*rateUBBitPerSec <= 32000.0) {
    dVar6 = *rateUBBitPerSec;
  }
  *rateUBBitPerSec = dVar6;
  return 0;
}

Assistant:

int16_t WebRtcIsac_RateAllocation(int32_t inRateBitPerSec,
                                        double* rateLBBitPerSec,
                                        double* rateUBBitPerSec,
                                        enum ISACBandwidth* bandwidthKHz) {
  int16_t idx;
  double idxD;
  double idxErr;
  if (inRateBitPerSec < 38000) {
    /* If the given overall bottleneck is less than 38000 then
     * then codec has to operate in wideband mode, i.e. 8 kHz
     * bandwidth. */
    *rateLBBitPerSec = (int16_t)((inRateBitPerSec > 32000) ?
        32000 : inRateBitPerSec);
    *rateUBBitPerSec = 0;
    *bandwidthKHz = isac8kHz;
  } else if ((inRateBitPerSec >= 38000) && (inRateBitPerSec < 50000)) {
    /* At a bottleneck between 38 and 50 kbps the codec is operating
     * at 12 kHz bandwidth. Using xxxBandBitRate12[] to calculates
     * upper/lower bottleneck */

    /* Find the bottlenecks by linear interpolation,
     * step is (45000 - 38000)/6.0 we use the inverse of it. */
    const double stepSizeInv = 8.5714286e-4;
    idxD = (inRateBitPerSec - 38000) * stepSizeInv;
    idx = (idxD >= 6) ? 6 : ((int16_t)idxD);
    idxErr = idxD - idx;
    *rateLBBitPerSec = kLowerBandBitRate12[idx];
    *rateUBBitPerSec = kUpperBandBitRate12[idx];

    if (idx < 6) {
      *rateLBBitPerSec += (int16_t)(
          idxErr * (kLowerBandBitRate12[idx + 1] - kLowerBandBitRate12[idx]));
      *rateUBBitPerSec += (int16_t)(
          idxErr * (kUpperBandBitRate12[idx + 1] - kUpperBandBitRate12[idx]));
    }
    *bandwidthKHz = isac12kHz;
  } else if ((inRateBitPerSec >= 50000) && (inRateBitPerSec <= 56000)) {
    /* A bottleneck between 50 and 56 kbps corresponds to bandwidth
     * of 16 kHz. Using xxxBandBitRate16[] to calculates
     * upper/lower bottleneck. */

    /* Find the bottlenecks by linear interpolation
     * step is (56000 - 50000)/5 we use the inverse of it. */
    const double stepSizeInv = 8.3333333e-4;
    idxD = (inRateBitPerSec - 50000) * stepSizeInv;
    idx = (idxD >= 5) ? 5 : ((int16_t)idxD);
    idxErr = idxD - idx;
    *rateLBBitPerSec = kLowerBandBitRate16[idx];
    *rateUBBitPerSec  = kUpperBandBitRate16[idx];

    if (idx < 5) {
      *rateLBBitPerSec += (int16_t)(idxErr *
          (kLowerBandBitRate16[idx + 1] -
              kLowerBandBitRate16[idx]));

      *rateUBBitPerSec += (int16_t)(idxErr *
          (kUpperBandBitRate16[idx + 1] -
              kUpperBandBitRate16[idx]));
    }
    *bandwidthKHz = isac16kHz;
  } else {
    /* Out-of-range botlteneck value. */
    return -1;
  }

  /* limit the values. */
  *rateLBBitPerSec = (*rateLBBitPerSec > 32000) ? 32000 : *rateLBBitPerSec;
  *rateUBBitPerSec = (*rateUBBitPerSec > 32000) ? 32000 : *rateUBBitPerSec;
  return 0;
}